

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

void __thiscall
helics::apps::Connector::scanUnconnectedInterfaces
          (Connector *this,ConnectionsList *possibleConnections)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *tagList;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  *puVar1;
  string_view *psVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  bool bVar3;
  _Base_ptr p_Var4;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::apps::PotentialConnections>_>_>
  *puVar5;
  basic_string_view<char,_std::char_traits<char>_> *uInp;
  string_view *psVar6;
  string_view target;
  string_view target_00;
  string_view target_01;
  string_view target_02;
  set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  aliasList;
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_60;
  
  psVar6 = (possibleConnections->unconnectedInputs).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (possibleConnections->unconnectedInputs).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  tagList = &possibleConnections->tagCodes;
  puVar1 = &possibleConnections->potentialPubs;
  do {
    if (psVar6 == psVar2) {
      psVar6 = (possibleConnections->unconnectedPubs).
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar2 = (possibleConnections->unconnectedPubs).
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar1 = &possibleConnections->potentialInputs;
      do {
        if (psVar6 == psVar2) {
          psVar6 = (possibleConnections->unconnectedSourceEndpoints).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          psVar2 = (possibleConnections->unconnectedSourceEndpoints).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          puVar1 = &possibleConnections->potentialEndpoints;
          do {
            if (psVar6 == psVar2) {
              psVar6 = (possibleConnections->unconnectedTargetEndpoints).
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              psVar2 = (possibleConnections->unconnectedTargetEndpoints).
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              do {
                if (psVar6 == psVar2) {
                  return;
                }
                puVar5 = puVar1;
                bVar3 = makePotentialConnection
                                  (this,*psVar6,tagList,puVar1,&possibleConnections->aliases);
                if ((!bVar3) && ((possibleConnections->aliases)._M_h._M_element_count != 0)) {
                  target_02._M_str = (char *)possibleConnections;
                  target_02._M_len = (size_t)psVar6->_M_str;
                  generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                   *)&local_60,(apps *)psVar6->_M_len,target_02,
                                  (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                   *)puVar5);
                  for (p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
                      (_Rb_tree_header *)p_Var4 != &local_60._M_impl.super__Rb_tree_header;
                      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
                    __y_02._M_len = psVar6->_M_len;
                    __y_02._M_str = psVar6->_M_str;
                    bVar3 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                             (p_Var4 + 1),__y_02);
                    if (!bVar3) {
                      bVar3 = makePotentialConnection
                                        (this,*(string_view *)(p_Var4 + 1),tagList,puVar1,
                                         &possibleConnections->aliases);
                      if (bVar3) break;
                    }
                  }
                  CLI::std::
                  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  ::~_Rb_tree(&local_60);
                }
                psVar6 = psVar6 + 1;
              } while( true );
            }
            puVar5 = puVar1;
            bVar3 = makePotentialConnection
                              (this,*psVar6,tagList,puVar1,&possibleConnections->aliases);
            if ((!bVar3) && ((possibleConnections->aliases)._M_h._M_element_count != 0)) {
              target_01._M_str = (char *)possibleConnections;
              target_01._M_len = (size_t)psVar6->_M_str;
              generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               *)&local_60,(apps *)psVar6->_M_len,target_01,
                              (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                               *)puVar5);
              for (p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var4 != &local_60._M_impl.super__Rb_tree_header;
                  p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
                __y_01._M_len = psVar6->_M_len;
                __y_01._M_str = psVar6->_M_str;
                bVar3 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                         (p_Var4 + 1),__y_01);
                if (!bVar3) {
                  bVar3 = makePotentialConnection
                                    (this,*(string_view *)(p_Var4 + 1),tagList,puVar1,
                                     &possibleConnections->aliases);
                  if (bVar3) break;
                }
              }
              CLI::std::
              _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::~_Rb_tree(&local_60);
            }
            psVar6 = psVar6 + 1;
          } while( true );
        }
        puVar5 = puVar1;
        bVar3 = makePotentialConnection(this,*psVar6,tagList,puVar1,&possibleConnections->aliases);
        if ((!bVar3) && ((possibleConnections->aliases)._M_h._M_element_count != 0)) {
          target_00._M_str = (char *)possibleConnections;
          target_00._M_len = (size_t)psVar6->_M_str;
          generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)&local_60,(apps *)psVar6->_M_len,target_00,
                          (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                           *)puVar5);
          for (p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var4 != &local_60._M_impl.super__Rb_tree_header;
              p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
            __y_00._M_len = psVar6->_M_len;
            __y_00._M_str = psVar6->_M_str;
            bVar3 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)
                                     (p_Var4 + 1),__y_00);
            if (!bVar3) {
              bVar3 = makePotentialConnection
                                (this,*(string_view *)(p_Var4 + 1),tagList,puVar1,
                                 &possibleConnections->aliases);
              if (bVar3) break;
            }
          }
          CLI::std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::~_Rb_tree(&local_60);
        }
        psVar6 = psVar6 + 1;
      } while( true );
    }
    puVar5 = puVar1;
    bVar3 = makePotentialConnection(this,*psVar6,tagList,puVar1,&possibleConnections->aliases);
    if ((!bVar3) && ((possibleConnections->aliases)._M_h._M_element_count != 0)) {
      target._M_str = (char *)possibleConnections;
      target._M_len = (size_t)psVar6->_M_str;
      generateAliases((set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       *)&local_60,(apps *)psVar6->_M_len,target,
                      (unordered_multimap<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                       *)puVar5);
      for (p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &local_60._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4)) {
        __y._M_len = psVar6->_M_len;
        __y._M_str = psVar6->_M_str;
        bVar3 = std::operator==(*(basic_string_view<char,_std::char_traits<char>_> *)(p_Var4 + 1),
                                __y);
        if (!bVar3) {
          bVar3 = makePotentialConnection
                            (this,*(string_view *)(p_Var4 + 1),tagList,puVar1,
                             &possibleConnections->aliases);
          if (bVar3) break;
        }
      }
      CLI::std::
      _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ::~_Rb_tree(&local_60);
    }
    psVar6 = psVar6 + 1;
  } while( true );
}

Assistant:

void Connector::scanUnconnectedInterfaces(ConnectionsList& possibleConnections)
{
    /** unconnected inputs*/
    for (const auto& uInp : possibleConnections.unconnectedInputs) {
        if (makePotentialConnection(uInp,
                                    possibleConnections.tagCodes,
                                    possibleConnections.potentialPubs,
                                    possibleConnections.aliases)) {
            continue;
        }
        if (!possibleConnections.aliases.empty()) {
            auto aliasList = generateAliases(uInp, possibleConnections.aliases);
            for (const auto& alias : aliasList) {
                if (alias == uInp) {
                    continue;
                }
                if (makePotentialConnection(alias,
                                            possibleConnections.tagCodes,
                                            possibleConnections.potentialPubs,
                                            possibleConnections.aliases)) {
                    break;
                }
            }
        }
    }

    /** unconnected publications*/
    for (const auto& uPub : possibleConnections.unconnectedPubs) {
        if (makePotentialConnection(uPub,
                                    possibleConnections.tagCodes,
                                    possibleConnections.potentialInputs,
                                    possibleConnections.aliases)) {
            continue;
        }
        if (!possibleConnections.aliases.empty()) {
            auto aliasList = generateAliases(uPub, possibleConnections.aliases);
            for (const auto& alias : aliasList) {
                if (alias == uPub) {
                    continue;
                }
                if (makePotentialConnection(alias,
                                            possibleConnections.tagCodes,
                                            possibleConnections.potentialInputs,
                                            possibleConnections.aliases)) {
                    break;
                }
            }
        }
    }

    /** unconnected source endpoints*/
    for (const auto& uEnd : possibleConnections.unconnectedSourceEndpoints) {
        if (makePotentialConnection(uEnd,
                                    possibleConnections.tagCodes,
                                    possibleConnections.potentialEndpoints,
                                    possibleConnections.aliases)) {
            continue;
        }
        if (!possibleConnections.aliases.empty()) {
            auto aliasList = generateAliases(uEnd, possibleConnections.aliases);
            for (const auto& alias : aliasList) {
                if (alias == uEnd) {
                    continue;
                }
                if (makePotentialConnection(alias,
                                            possibleConnections.tagCodes,
                                            possibleConnections.potentialEndpoints,
                                            possibleConnections.aliases)) {
                    break;
                }
            }
        }
    }

    /** unconnected target endpoints*/
    for (const auto& uEnd : possibleConnections.unconnectedTargetEndpoints) {
        if (makePotentialConnection(uEnd,
                                    possibleConnections.tagCodes,
                                    possibleConnections.potentialEndpoints,
                                    possibleConnections.aliases)) {
            continue;
        }
        if (!possibleConnections.aliases.empty()) {
            auto aliasList = generateAliases(uEnd, possibleConnections.aliases);
            for (const auto& alias : aliasList) {
                if (alias == uEnd) {
                    continue;
                }
                if (makePotentialConnection(alias,
                                            possibleConnections.tagCodes,
                                            possibleConnections.potentialEndpoints,
                                            possibleConnections.aliases)) {
                    break;
                }
            }
        }
    }
}